

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

Territory __thiscall QLocalePrivate::codeToTerritory(QLocalePrivate *this,QStringView code)

{
  char32_t cVar1;
  char32_t cVar2;
  char32_t cVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  ushort *puVar7;
  
  puVar7 = (ushort *)code.m_size;
  uVar6 = 0;
  if ((undefined1 *)0xfffffffffffffffd < &this[-1].field_0x1c) {
    cVar1 = QChar::toUpper((uint)*puVar7);
    cVar2 = QChar::toUpper((uint)puVar7[1]);
    if (2 < (long)this) {
      cVar3 = QChar::toUpper((uint)puVar7[2]);
      uVar6 = cVar3 & 0xffff;
    }
    bVar5 = 0x5a;
    lVar4 = 0;
    do {
      if ((((ushort)cVar1 == (ushort)bVar5) && ((ushort)cVar2 == (ushort)"ZZ"[lVar4 + 1])) &&
         (uVar6 == "ZZ"[lVar4 + 2])) {
        return (Territory)(lVar4 / 3);
      }
      bVar5 = "ZZ"[lVar4 + 3];
      lVar4 = lVar4 + 3;
    } while (bVar5 != 0);
  }
  return AnyCountry;
}

Assistant:

QLocale::Territory QLocalePrivate::codeToTerritory(QStringView code) noexcept
{
    const auto len = code.size();
    if (len != 2 && len != 3)
        return QLocale::AnyTerritory;

    char16_t uc1 = code[0].toUpper().unicode();
    char16_t uc2 = code[1].toUpper().unicode();
    char16_t uc3 = len > 2 ? code[2].toUpper().unicode() : 0;

    const unsigned char *c = territory_code_list;
    for (; *c != 0; c += 3) {
        if (uc1 == c[0] && uc2 == c[1] && uc3 == c[2])
            return QLocale::Territory((c - territory_code_list)/3);
    }

    return QLocale::AnyTerritory;
}